

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void scale_references_fpmt(AV1_COMP *cpi,int *ref_buffers_used_map)

{
  int iVar1;
  uint *in_RSI;
  AV1_COMP *in_RDI;
  int i;
  RefCntBuffer *buf;
  YV12_BUFFER_CONFIG *ref;
  MV_REFERENCE_FRAME ref_frame;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffffcc;
  AV1_COMMON *in_stack_ffffffffffffffd0;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  char cVar2;
  
  for (cVar2 = '\x01'; cVar2 < '\b'; cVar2 = cVar2 + '\x01') {
    if ((in_RDI->ref_frame_flags & (uint)""[cVar2]) == 0) {
      iVar1 = has_no_stats_stage(in_RDI);
      if (iVar1 == 0) {
        in_RDI->scaled_ref_buf[cVar2 + -1] = (RefCntBuffer *)0x0;
      }
    }
    else {
      in_stack_ffffffffffffffd8 =
           get_ref_frame_yv12_buf
                     ((AV1_COMMON *)CONCAT17(cVar2,in_stack_ffffffffffffffe0),
                      (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
      if (in_stack_ffffffffffffffd8 == (YV12_BUFFER_CONFIG *)0x0) {
        in_RDI->scaled_ref_buf[cVar2 + -1] = (RefCntBuffer *)0x0;
      }
      else {
        in_stack_ffffffffffffffd0 =
             (AV1_COMMON *)
             get_ref_frame_buf(in_stack_ffffffffffffffd0,
                               (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffffcc >> 0x18));
        in_RDI->scaled_ref_buf[cVar2 + -1] = (RefCntBuffer *)in_stack_ffffffffffffffd0;
        for (in_stack_ffffffffffffffcc = 0;
            in_stack_ffffffffffffffcc < (int)(uint)((in_RDI->common).buffer_pool)->num_frame_bufs;
            in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1) {
          if ((AV1_COMMON *)(((in_RDI->common).buffer_pool)->frame_bufs + in_stack_ffffffffffffffcc)
              == in_stack_ffffffffffffffd0) {
            *in_RSI = 1 << ((byte)in_stack_ffffffffffffffcc & 0x1f) | *in_RSI;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void scale_references_fpmt(AV1_COMP *cpi, int *ref_buffers_used_map) {
  AV1_COMMON *cm = &cpi->common;
  MV_REFERENCE_FRAME ref_frame;

  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    // Need to convert from AOM_REFFRAME to index into ref_mask (subtract 1).
    if (cpi->ref_frame_flags & av1_ref_frame_flag_list[ref_frame]) {
      const YV12_BUFFER_CONFIG *const ref =
          get_ref_frame_yv12_buf(cm, ref_frame);

      if (ref == NULL) {
        cpi->scaled_ref_buf[ref_frame - 1] = NULL;
        continue;
      }

      // FPMT does not support scaling yet.
      assert(ref->y_crop_width == cm->width &&
             ref->y_crop_height == cm->height);

      RefCntBuffer *buf = get_ref_frame_buf(cm, ref_frame);
      cpi->scaled_ref_buf[ref_frame - 1] = buf;
      for (int i = 0; i < cm->buffer_pool->num_frame_bufs; ++i) {
        if (&cm->buffer_pool->frame_bufs[i] == buf) {
          *ref_buffers_used_map |= (1 << i);
        }
      }
    } else {
      if (!has_no_stats_stage(cpi)) cpi->scaled_ref_buf[ref_frame - 1] = NULL;
    }
  }
}